

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventFilter.hpp
# Opt level: O0

size_t __thiscall
binlog::EventFilter::writeAllowed<binlog::TextOutputStream>
          (EventFilter *this,char *buffer,size_t bufferSize,TextOutputStream *out)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  ulong uVar4;
  _Rb_tree_const_iterator<unsigned_long> in_RCX;
  size_t in_RDX;
  char *in_RSI;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar5;
  size_t sizePrefixedSize;
  EventSource eventSource;
  bool special;
  uint64_t tag;
  Range payload;
  uint32_t size;
  Range entry;
  Range entries;
  size_t totalWriteSize;
  EventSource *in_stack_fffffffffffffe78;
  TextOutputStream *in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  _Rb_tree_const_iterator<unsigned_long> in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *this_00;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> local_128 [3];
  undefined1 local_69;
  unsigned_long local_68;
  Range local_60;
  uint local_4c;
  char *local_48;
  char *local_40;
  Range local_38;
  size_t local_28;
  TextOutputStream *local_20;
  
  local_28 = 0;
  local_20 = (TextOutputStream *)in_RCX._M_node;
  Range::Range(&local_38,in_RSI,in_RDX);
LAB_0010dbcd:
  bVar1 = Range::empty(&local_38);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return local_28;
  }
  local_48 = local_38._begin;
  local_40 = local_38._end;
  local_4c = Range::read<unsigned_int>((Range *)in_stack_fffffffffffffe80);
  pcVar2 = Range::view((Range *)in_stack_fffffffffffffe90._M_node,
                       CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
  Range::Range(&local_60,pcVar2,(ulong)local_4c);
  local_68 = Range::read<unsigned_long>((Range *)in_stack_fffffffffffffe80);
  local_69 = (local_68 & 0x8000000000000000) != 0;
  if (!(bool)local_69) goto LAB_0010dd39;
  if (local_68 == 0xffffffffffffffff) {
    this_00 = local_128;
    EventSource::EventSource((EventSource *)in_stack_fffffffffffffe80);
    mserialize::deserialize<binlog::EventSource,binlog::Range>
              ((EventSource *)in_stack_fffffffffffffe80,(Range *)in_stack_fffffffffffffe78);
    bVar1 = std::function<bool_(const_binlog::EventSource_&)>::operator()
                      ((function<bool_(const_binlog::EventSource_&)> *)in_stack_fffffffffffffe80,
                       in_stack_fffffffffffffe78);
    if (bVar1) {
      pVar5 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
              insert(this_00,(value_type_conflict1 *)CONCAT17(bVar1,in_stack_fffffffffffffe98));
      in_RCX = pVar5.first._M_node;
      in_stack_fffffffffffffe8f = pVar5.second;
      in_stack_fffffffffffffe90._M_node = in_RCX._M_node;
    }
    EventSource::~EventSource((EventSource *)in_stack_fffffffffffffe80);
  }
  goto LAB_0010dd5c;
LAB_0010dd39:
  sVar3 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::count
                    ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )in_stack_fffffffffffffe90._M_node,
                     (key_type *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
  if (sVar3 != 0) {
LAB_0010dd5c:
    uVar4 = (ulong)local_4c;
    in_stack_fffffffffffffe80 = local_20;
    pcVar2 = Range::view((Range *)in_stack_fffffffffffffe90._M_node,
                         CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
    TextOutputStream::write
              (in_stack_fffffffffffffe80,(int)pcVar2,(void *)(uVar4 + 4),(size_t)in_RCX._M_node);
    local_28 = (long)(uVar4 + 4) + local_28;
  }
  goto LAB_0010dbcd;
}

Assistant:

std::size_t EventFilter::writeAllowed(const char* buffer, std::size_t bufferSize, OutputStream& out)
{
  std::size_t totalWriteSize = 0;

  Range entries(buffer, bufferSize);

  while (! entries.empty())
  {
    Range entry = entries;
    const std::uint32_t size = entries.read<std::uint32_t>();
    Range payload(entries.view(size), size);
    const std::uint64_t tag = payload.read<std::uint64_t>();
    const bool special = (tag & (std::uint64_t(1) << 63)) != 0;

    if (special)
    {
      // event sources are inspected to populate _allowedSourceIds
      if (tag == EventSource::Tag)
      {
        EventSource eventSource;
        mserialize::deserialize(eventSource, payload);
        if (_isAllowed(eventSource))
        {
          _allowedSourceIds.insert(eventSource.id);
        }
        // else: event source is not allowed, events referencing it
        // will not be written.
      }
    }
    else if (_allowedSourceIds.count(tag) == 0)
    {
      // event is produced by a disallowed source, ignore it
      continue;
    }

    // either special entry or event produced by an allowed source, write it
    // TODO(benedek) perf: batch contiguous entries into one out.write
    const std::size_t sizePrefixedSize = size + sizeof(size);
    out.write(entry.view(sizePrefixedSize), std::streamsize(sizePrefixedSize));
    totalWriteSize += sizePrefixedSize;
  }

  return totalWriteSize;
}